

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O3

char * str_find(char *haystack,char *needle)

{
  char *pcVar1;
  long lVar2;
  char cVar3;
  char cVar4;
  
  do {
    cVar3 = *haystack;
    if (cVar3 == '\0') {
      return (char *)0x0;
    }
    pcVar1 = haystack;
    lVar2 = 0;
    do {
      cVar4 = needle[lVar2];
      if (cVar3 != cVar4) goto LAB_001d1066;
      cVar3 = haystack[lVar2 + 1];
      lVar2 = lVar2 + 1;
    } while (cVar3 != '\0');
    cVar4 = needle[lVar2];
LAB_001d1066:
    haystack = haystack + 1;
    if (cVar4 == '\0') {
      return pcVar1;
    }
  } while( true );
}

Assistant:

const char *str_find(const char *haystack, const char *needle)
{
	while(*haystack) /* native implementation */
	{
		const char *a = haystack;
		const char *b = needle;
		while(*a && *b && *a == *b)
		{
			a++;
			b++;
		}
		if(!(*b))
			return haystack;
		haystack++;
	}

	return 0;
}